

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3_math.h
# Opt level: O0

double grisu3_cast_double_from_diy_fp(grisu3_diy_fp_t n)

{
  int iVar1;
  long local_58;
  uint64_t e_biased;
  grisu3_diy_fp_t v;
  int exp_pos;
  int exp_bias;
  int denorm_exp;
  uint64_t frac_mask;
  uint64_t hidden_bit;
  grisu3_diy_fp_t n_local;
  
  iVar1 = n.e;
  for (e_biased = n.f; 0x1fffffffffffff < e_biased; e_biased = e_biased >> 1) {
    iVar1 = iVar1 + 1;
  }
  if (iVar1 < -0x432) {
    n_local.e = 0;
    n_local._12_4_ = 0;
  }
  else {
    for (; -0x432 < iVar1 && (e_biased & 0x10000000000000) == 0; iVar1 = iVar1 + -1) {
      e_biased = e_biased << 1;
    }
    if ((iVar1 == -0x432) && ((e_biased & 0x10000000000000) == 0)) {
      local_58 = 0;
    }
    else {
      local_58 = (long)(iVar1 + 0x433);
    }
    n_local._8_8_ = grisu3_cast_double_from_uint64(e_biased & 0xfffffffffffff | local_58 << 0x34);
  }
  return (double)n_local._8_8_;
}

Assistant:

static double grisu3_cast_double_from_diy_fp(grisu3_diy_fp_t n)
{
    const uint64_t hidden_bit = GRISU3_D64_IMPLICIT_ONE;
    const uint64_t frac_mask = GRISU3_D64_FRACT_MASK;
    const int denorm_exp = GRISU3_D64_DENORM_EXP;
    const int exp_bias = GRISU3_D64_EXP_BIAS;
    const int exp_pos = GRISU3_D64_EXP_POS;

    grisu3_diy_fp_t v = n;
    uint64_t e_biased;

    while (v.f > hidden_bit + frac_mask) {
        v.f >>= 1;
        ++v.e;
    }
    if (v.e < denorm_exp) {
        return 0.0;
    }
    while (v.e > denorm_exp && (v.f & hidden_bit) == 0) {
        v.f <<= 1;
        --v.e;
    }
    if (v.e == denorm_exp && (v.f & hidden_bit) == 0) {
        e_biased = 0;
    } else {
        e_biased = (uint64_t)(v.e + exp_bias);
    }
    return grisu3_cast_double_from_uint64((v.f & frac_mask) | (e_biased << exp_pos));
}